

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VanEmdeBoasTree.cpp
# Opt level: O0

bool __thiscall VanEmdeBoasTree::predecessor(VanEmdeBoasTree *this,Node *root,int value,int *result)

{
  bool bVar1;
  char *pcVar2;
  int local_44 [2];
  int tmp;
  int j;
  int i;
  int highVal;
  int lowVal;
  int *result_local;
  Node *pNStack_20;
  int value_local;
  Node *root_local;
  VanEmdeBoasTree *this_local;
  
  if (root == (Node *)0x0) {
    this_local._7_1_ = false;
  }
  else if ((value < 0) || (root->uni < value)) {
    this_local._7_1_ = false;
  }
  else if (root->max < value) {
    *result = root->max;
    this_local._7_1_ = true;
  }
  else if (root->summary == (Node *)0x0) {
    if (root->min < value) {
      *result = root->min;
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    _highVal = result;
    result_local._4_4_ = value;
    pNStack_20 = root;
    root_local = (Node *)this;
    i = low(this,root,value);
    tmp = high(this,pNStack_20,result_local._4_4_);
    local_44[1] = 0x80000000;
    j = tmp;
    bVar1 = findMin(this,pNStack_20->cluster[tmp],local_44);
    if ((bVar1) && (local_44[0] < i)) {
      bVar1 = predecessor(this,pNStack_20->cluster[tmp],i,local_44 + 1);
      if (!bVar1) {
        return false;
      }
    }
    else {
      bVar1 = predecessor(this,pNStack_20->summary,j,&tmp);
      if (!bVar1) {
        if (pNStack_20->min < result_local._4_4_) {
          *_highVal = pNStack_20->min;
          return true;
        }
        return false;
      }
      bVar1 = findMax(this,pNStack_20->cluster[tmp],local_44 + 1);
      if (!bVar1) {
        return false;
      }
    }
    pcVar2 = index(this,(char *)pNStack_20,tmp);
    *_highVal = (int)pcVar2;
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool VanEmdeBoasTree::predecessor(Node *root, int value, int &result) {
    if (!root) {
        return false;
    }

    if (value < 0 || value > root->uni) {
        return false;
    }

    if (root->max < value) {
        result = root->max;
        return true;
    }

    if (!root->summary) {
        if (root->min < value) {
            result = root->min;
            return true;
        }
        return false;
    }

    int lowVal = low(root, value);
    int highVal = high(root, value);
    int i = highVal;
    int j = INT_MIN;
    int tmp;
    if (findMin(root->cluster[i], tmp) && lowVal > tmp) {
        if (!predecessor(root->cluster[i], lowVal, j)) {
            return false;
        }
    } else {
        if (!predecessor(root->summary, highVal, i)) {
            if (root->min < value) {
                result = root->min;
                return true;
            }
            return false;
        }
        if (!findMax(root->cluster[i], j)) return false;
    }

    result = index(root, i, j);
    return true;
}